

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_embedded.cc
# Opt level: O2

void __thiscall EmbeddedCode::GenCode(EmbeddedCode *this,Output *out,Env *env)

{
  vector<EmbeddedCodeSegment*,std::allocator<EmbeddedCodeSegment*>> *this_00;
  EmbeddedCodeSegment *this_01;
  EmbeddedCodeSegmentList *pEVar1;
  pointer ppEVar2;
  string local_50;
  
  if ((this->current_segment_)._M_string_length != 0) {
    this_00 = (vector<EmbeddedCodeSegment*,std::allocator<EmbeddedCodeSegment*>> *)this->segments_;
    this_01 = (EmbeddedCodeSegment *)operator_new(0x28);
    EmbeddedCodeSegment::EmbeddedCodeSegment(this_01,&this->current_segment_);
    local_50._M_dataplus._M_p = (pointer)this_01;
    std::vector<EmbeddedCodeSegment*,std::allocator<EmbeddedCodeSegment*>>::
    emplace_back<EmbeddedCodeSegment*>(this_00,(EmbeddedCodeSegment **)&local_50);
    std::__cxx11::string::assign((char *)&this->current_segment_);
  }
  env->allow_undefined_id_ = true;
  pEVar1 = this->segments_;
  if (pEVar1 != (EmbeddedCodeSegmentList *)0x0) {
    for (ppEVar2 = (pEVar1->
                   super__Vector_base<EmbeddedCodeSegment_*,_std::allocator<EmbeddedCodeSegment_*>_>
                   )._M_impl.super__Vector_impl_data._M_start;
        ppEVar2 !=
        (pEVar1->super__Vector_base<EmbeddedCodeSegment_*,_std::allocator<EmbeddedCodeSegment_*>_>).
        _M_impl.super__Vector_impl_data._M_finish; ppEVar2 = ppEVar2 + 1) {
      EmbeddedCodeSegment::ToCode_abi_cxx11_(&local_50,*ppEVar2,env);
      Output::print(out,"%s",local_50._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_50);
      pEVar1 = this->segments_;
    }
  }
  env->allow_undefined_id_ = false;
  Output::print(out,"\n");
  return;
}

Assistant:

void EmbeddedCode::GenCode(Output* out, Env* env)
	{
	if ( ! current_segment_.empty() )
		{
		segments_->push_back(new EmbeddedCodeSegment(current_segment_));
		current_segment_ = "";
		}

	// TODO: return to the generated file after embedded code
	// out->print("#line %d \"%s\"\n", line_num, filename.c_str());

	// Allow use of RValue for undefined ID, in which case the
	// ID's name is used as its RValue
	env->set_allow_undefined_id(true);

	foreach (i, EmbeddedCodeSegmentList, segments_)
		{
		EmbeddedCodeSegment* segment = *i;
		out->print("%s", segment->ToCode(env).c_str());
		}

	env->set_allow_undefined_id(false);
	out->print("\n");
	}